

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

void spirv_cross::inner::
     join_helper<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
               (StringStream<4096UL,_4096UL> *stream,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,
               char (*ts_2) [2])

{
  StringStream<4096UL,_4096UL>::append(stream,(t->_M_dataplus)._M_p,t->_M_string_length);
  StringStream<4096UL,_4096UL>::append(stream,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  join_helper<std::__cxx11::string,char_const(&)[2]>(stream,ts_1,ts_2);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}